

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O0

void __thiscall miniros::PollSet::PollSet(PollSet *this)

{
  int iVar1;
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  TransportPtr *in_stack_00000040;
  SocketUpdateFunc *in_stack_00000048;
  int in_stack_00000054;
  PollSet *in_stack_00000058;
  bool enabled;
  undefined8 in_stack_ffffffffffffff18;
  Level level;
  LogLocation *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  LogLocation *in_stack_ffffffffffffff30;
  Level in_stack_ffffffffffffff44;
  string *name;
  undefined4 in_stack_ffffffffffffff50;
  char *__s;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  PollSet *in_stack_ffffffffffffffb8;
  allocator<char> local_39;
  string local_38 [16];
  undefined8 in_stack_ffffffffffffffd8;
  
  level = (Level)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  __s = in_RDI;
  std::
  map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
  ::map((map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
         *)0x483fb9);
  std::mutex::mutex((mutex *)0x483fc7);
  in_RDI[0x58] = '\0';
  std::mutex::mutex((mutex *)0x483fd9);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x88);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x483fef);
  std::vector<pollfd,_std::allocator<pollfd>_>::vector
            ((vector<pollfd,_std::allocator<pollfd>_> *)0x484005);
  std::mutex::mutex((mutex *)0x484016);
  iVar1 = create_socket_watcher();
  *(int *)(in_RDI + 0xe8) = iVar1;
  iVar1 = create_signal_pair((signal_fd_t *)in_stack_ffffffffffffffd8);
  if (iVar1 != 0) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((PollSet::loc.initialized_ ^ 0xffU) & 1) != 0) {
      name = (string *)&local_39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,__s,(allocator<char> *)CONCAT44(iVar1,in_stack_ffffffffffffff50));
      console::initializeLogLocation
                ((LogLocation *)CONCAT44(iVar1,in_stack_ffffffffffffff50),name,
                 in_stack_ffffffffffffff44);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
    }
    if (PollSet::loc.level_ != Fatal) {
      console::setLogLocationLevel(in_stack_ffffffffffffff20,level);
      console::checkLogLocationEnabled(in_stack_ffffffffffffff30);
    }
    if ((PollSet::loc.logger_enabled_ & 1U) != 0) {
      console::print((FilterBase *)0x0,PollSet::loc.logger_,(Level)(ulong)PollSet::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                     ,0x37,"miniros::PollSet::PollSet()","create_signal_pair() failed");
    }
  }
  std::function<void(int)>::function<miniros::PollSet::PollSet()::__0,void>
            ((function<void_(int)> *)&stack0xffffffffffffffa0,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(*(undefined4 *)(__s + 0xe0),in_stack_ffffffffffffff28));
  std::shared_ptr<miniros::Transport>::shared_ptr((shared_ptr<miniros::Transport> *)0x484234);
  addSocket(in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000040);
  std::shared_ptr<miniros::Transport>::~shared_ptr((shared_ptr<miniros::Transport> *)0x484258);
  std::function<void_(int)>::~function((function<void_(int)> *)0x484265);
  addEvents(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

PollSet::PollSet()
    : sockets_changed_(false), epfd_(create_socket_watcher())
{
  if ( create_signal_pair(signal_pipe_) != 0 ) {
    MINIROS_FATAL("create_signal_pair() failed");
    MINIROS_BREAK();
  }
  addSocket(signal_pipe_[0], [this](int events){this->onLocalPipeEvents(events);});
  addEvents(signal_pipe_[0], POLLIN);
}